

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UndefDirectiveSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UndefDirectiveSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  size_t index_local;
  UndefDirectiveSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->super_DirectiveSyntax).directive.kind;
    token._2_1_ = (this->super_DirectiveSyntax).directive.field_0x2;
    token.numFlags.raw = (this->super_DirectiveSyntax).directive.numFlags.raw;
    token.rawLen = (this->super_DirectiveSyntax).directive.rawLen;
    token.info = (this->super_DirectiveSyntax).directive.info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UndefDirectiveSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return directive;
        case 1: return name;
        default: return nullptr;
    }
}